

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::StartSenderReport
          (RTCPCompoundPacketBuilder *this,uint32_t senderssrc,RTPNTPTime *ntptimestamp,
          uint32_t rtptimestamp,uint32_t packetcount,uint32_t octetcount)

{
  size_t sVar1;
  size_t sVar2;
  uint32_t *puVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  size_t sVar7;
  RTCPSenderReport *sr;
  uint32_t *ssrc;
  size_t neededsize;
  size_t sizeleft;
  size_t totalsize;
  uint32_t octetcount_local;
  uint32_t packetcount_local;
  uint32_t rtptimestamp_local;
  RTPNTPTime *ntptimestamp_local;
  uint32_t senderssrc_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else if ((this->report).headerlength == 0) {
    sVar1 = this->byesize;
    sVar2 = this->appsize;
    sVar7 = SDES::NeededBytes(&this->sdes);
    if (this->maximumpacketsize - (sVar1 + sVar2 + sVar7) < 0x1c) {
      this_local._4_4_ = -0x2b;
    }
    else {
      (this->report).headerlength = 0x18;
      (this->report).isSR = true;
      puVar3 = (uint32_t *)(this->report).headerdata;
      uVar5 = htonl(senderssrc);
      *puVar3 = uVar5;
      puVar4 = (this->report).headerdata;
      uVar6 = RTPNTPTime::GetMSW(ntptimestamp);
      uVar5 = htonl(uVar6);
      *(uint32_t *)(puVar4 + 4) = uVar5;
      uVar6 = RTPNTPTime::GetLSW(ntptimestamp);
      uVar5 = htonl(uVar6);
      *(uint32_t *)(puVar4 + 8) = uVar5;
      uVar5 = htonl(rtptimestamp);
      *(uint32_t *)(puVar4 + 0xc) = uVar5;
      uVar5 = htonl(packetcount);
      *(uint32_t *)(puVar4 + 0x10) = uVar5;
      uVar5 = htonl(octetcount);
      *(uint32_t *)(puVar4 + 0x14) = uVar5;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0x21;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::StartSenderReport(uint32_t senderssrc,const RTPNTPTime &ntptimestamp,uint32_t rtptimestamp,
                                                 uint32_t packetcount,uint32_t octetcount)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

	if (report.headerlength != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ALREADYGOTREPORT;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalsize = byesize+appsize+sdes.NeededBytes();
#else
	size_t totalsize = byesize+appsize+unknownsize+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sizeleft = maximumpacketsize-totalsize;
	size_t neededsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)+sizeof(RTCPSenderReport);
	
	if (neededsize > sizeleft)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;
	
	// fill in some things

	report.headerlength = sizeof(uint32_t)+sizeof(RTCPSenderReport);
	report.isSR = true;	
	
	uint32_t *ssrc = (uint32_t *)report.headerdata;
	*ssrc = htonl(senderssrc);

	RTCPSenderReport *sr = (RTCPSenderReport *)(report.headerdata + sizeof(uint32_t));
	sr->ntptime_msw = htonl(ntptimestamp.GetMSW());
	sr->ntptime_lsw = htonl(ntptimestamp.GetLSW());
	sr->rtptimestamp = htonl(rtptimestamp);
	sr->packetcount = htonl(packetcount);
	sr->octetcount = htonl(octetcount);

	return 0;
}